

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O0

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::removeCol(SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *lp,int j)

{
  int iVar1;
  int *piVar2;
  int in_EDX;
  long *in_RSI;
  long in_RDI;
  
  iVar1 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)0x42fed0);
  piVar2 = DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0x150),iVar1 + -1);
  iVar1 = *piVar2;
  piVar2 = DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0x150),in_EDX);
  *piVar2 = iVar1;
  (**(code **)(*in_RSI + 0xa8))(in_RSI,in_EDX);
  return;
}

Assistant:

void removeCol(SPxLPBase<R>& lp, int j)
   {
      m_cIdx[j] = m_cIdx[lp.nCols() - 1];
      lp.removeCol(j);
   }